

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printSrcIdx(MCInst *MI,uint Op,SStream *O)

{
  uint uVar1;
  uint8_t *puVar2;
  MCOperand *op;
  int reg;
  MCOperand *SegReg;
  SStream *O_local;
  uint Op_local;
  MCInst *MI_local;
  
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar2 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x3e;
    puVar2[0] = '\x03';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    MI->flat_insn->detail->groups
    [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] = MI->x86opsize;
    puVar2 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x4a;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x4e;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x52;
    puVar2[0] = '\x01';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x56;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\0';
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
  }
  op = MCInst_getOperand(MI,Op + 1);
  uVar1 = MCOperand_getReg(op);
  if (uVar1 != 0) {
    _printOperand(MI,Op + 1,O);
    if (MI->csh->detail != CS_OPT_OFF) {
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46) = uVar1;
    }
    SStream_concat0(O,":");
  }
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  printOperand(MI,Op,O);
  SStream_concat0(O,"]");
  set_mem_access(MI,false);
  return;
}

Assistant:

static void printSrcIdx(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *SegReg;
	int reg;

	if (MI->csh->detail) {
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;
	}

	SegReg = MCInst_getOperand(MI, Op+1);
	reg = MCOperand_getReg(SegReg);

	// If this has a segment register, print it.
	if (reg) {
		_printOperand(MI, Op+1, O);
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = reg;
		}

		SStream_concat0(O, ":");
	}

	SStream_concat0(O, "(");
	set_mem_access(MI, true);

	printOperand(MI, Op, O);

	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}